

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

int SoapySDRDevice_writeSetting(SoapySDRDevice *device,char *key,char *value)

{
  undefined1 *puVar1;
  allocator local_5a;
  allocator local_59;
  string local_58 [32];
  string local_38 [32];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_00141f38);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_38,key,&local_59);
  std::__cxx11::string::string(local_58,value,&local_5a);
  (**(code **)(*(long *)device + 0x2f8))(device,local_38,local_58);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int SoapySDRDevice_writeSetting(SoapySDRDevice *device, const char *key, const char *value)
{
    __SOAPY_SDR_C_TRY
    device->writeSetting(key, value);
    __SOAPY_SDR_C_CATCH
}